

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

path * __thiscall
hta::storage::file::Metric::path_hta_abi_cxx11_
          (path *__return_storage_ptr__,Metric *this,Duration interval)

{
  rep rVar1;
  ostream *poVar2;
  string_type local_208;
  path local_1e8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_1b0;
  stringstream local_1a8 [8];
  stringstream ss;
  undefined1 local_198 [376];
  Metric *local_20;
  Metric *this_local;
  Duration interval_local;
  
  local_20 = this;
  this_local = (Metric *)interval.__r;
  interval_local.__r = (rep)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1b0.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)&this_local);
  rVar1 = Catch::clara::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_1b0)
  ;
  poVar2 = (ostream *)std::ostream::operator<<(local_198,rVar1);
  std::operator<<(poVar2,".hta");
  std::__cxx11::stringstream::str();
  std::filesystem::__cxx11::path::path(&local_1e8,&local_208,auto_format);
  Catch::clara::std::filesystem::__cxx11::operator/
            ((path *)__return_storage_ptr__,(path *)&this->path_,(path *)&local_1e8);
  Catch::clara::std::filesystem::__cxx11::path::~path((path *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::filesystem::path Metric::path_hta(Duration interval)
{
    std::stringstream ss;
    ss << std::chrono::duration_cast<std::chrono::nanoseconds>(interval).count() << ".hta";
    return path_ / std::filesystem::path(ss.str());
}